

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::PrintAction(BaseTag *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  ACT_TYPE action_local;
  BaseTag *this_local;
  
  switch(action) {
  case 0:
    poVar1 = std::operator<<(out,"North");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 1:
    poVar1 = std::operator<<(out,"East");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 2:
    poVar1 = std::operator<<(out,"South");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 3:
    poVar1 = std::operator<<(out,"West");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 4:
    poVar1 = std::operator<<(out,"Tag");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar1 = std::operator<<(out,"Wrong action");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return;
}

Assistant:

void BaseTag::PrintAction(ACT_TYPE action, ostream& out) const {
	switch(action) {
		case 0: out << "North" << endl; break;
		case 1: out << "East" << endl; break;
		case 2: out << "South" << endl; break;
		case 3: out << "West" << endl; break;
		case 4: out << "Tag" << endl; break;
		default: out << "Wrong action" << endl; exit(1);
	}
}